

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O0

void mod_inv_free(model_inventory_t *minv)

{
  model_inventory_t *minv_local;
  
  if (minv->mixw != (float32 ***)0x0) {
    ckd_free_3d(minv->mixw);
  }
  minv->mixw = (float32 ***)0x0;
  if (minv->mixw_acc != (float32 ***)0x0) {
    ckd_free_3d(minv->mixw_acc);
  }
  minv->mixw_acc = (float32 ***)0x0;
  if (minv->l_mixw_acc != (float32 ***)0x0) {
    ckd_free_3d(minv->l_mixw_acc);
  }
  minv->l_mixw_acc = (float32 ***)0x0;
  if (minv->mixw_inverse != (uint32 *)0x0) {
    ckd_free(minv->mixw_inverse);
  }
  minv->mixw_inverse = (uint32 *)0x0;
  gauden_free(minv->gauden);
  minv->gauden = (gauden_t *)0x0;
  if (minv->cb_inverse != (uint32 *)0x0) {
    ckd_free(minv->cb_inverse);
  }
  minv->cb_inverse = (uint32 *)0x0;
  if (minv->tmat != (float32 ***)0x0) {
    ckd_free_3d(minv->tmat);
  }
  minv->tmat = (float32 ***)0x0;
  if (minv->tmat_acc != (float32 ***)0x0) {
    ckd_free_3d(minv->tmat_acc);
  }
  minv->tmat_acc = (float32 ***)0x0;
  if (minv->l_tmat_acc != (float32 **)0x0) {
    ckd_free_2d(minv->l_tmat_acc);
  }
  minv->l_tmat_acc = (float32 **)0x0;
  ckd_free(minv);
  return;
}

Assistant:

void
mod_inv_free(model_inventory_t *minv)
{
    /* Free mixing weight related stuff */
    if (minv->mixw) {
	ckd_free_3d((void ***)minv->mixw);
    }
    minv->mixw = NULL;

    if (minv->mixw_acc) {
	ckd_free_3d((void ***)minv->mixw_acc);
    }
    minv->mixw_acc = NULL;

    if (minv->l_mixw_acc) {
	ckd_free_3d((void ***)minv->l_mixw_acc);
    }
    minv->l_mixw_acc = NULL;

    if (minv->mixw_inverse)
	ckd_free((void *)minv->mixw_inverse);
    minv->mixw_inverse = NULL;

    /* Free density related stuff */
    gauden_free(minv->gauden);
    minv->gauden = NULL;

    if (minv->cb_inverse)
	ckd_free((void *)minv->cb_inverse);
    minv->cb_inverse = NULL;

    /* Free transition matrix related stuff */
    if (minv->tmat) {
	ckd_free_3d((void ***)minv->tmat);
    }
    minv->tmat = NULL;

    if (minv->tmat_acc) {
	ckd_free_3d((void ***)minv->tmat_acc);
    }
    minv->tmat_acc = NULL;

    if (minv->l_tmat_acc) {
	ckd_free_2d((void **)minv->l_tmat_acc);
    }
    minv->l_tmat_acc = NULL;

    /* Free the top-level inventory structure */
    ckd_free(minv);
}